

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.c
# Opt level: O1

char * utf8_iterate(char *buffer,size_t bufsize,int32_t *codepoint)

{
  byte bVar1;
  uint uVar2;
  uchar u;
  size_t sVar3;
  ulong size;
  int32_t value;
  uint local_1c;
  
  if (bufsize != 0) {
    bVar1 = *buffer;
    size = 1;
    if ((char)bVar1 < '\0') {
      if ((bVar1 & 0xfe) == 0xc0 || bVar1 < 0xc0) {
        size = 0;
      }
      else {
        size = 2;
        if ((0xdf < bVar1) && (size = 3, 0xef < bVar1)) {
          size = (ulong)(bVar1 < 0xf5) << 2;
        }
      }
    }
    if ((size == 0) ||
       ((uVar2 = (uint)bVar1, (int)size != 1 &&
        ((bufsize < size ||
         (sVar3 = utf8_check_full(buffer,size,(int32_t *)&local_1c), uVar2 = local_1c, sVar3 == 0)))
        ))) {
      buffer = (char *)0x0;
    }
    else {
      local_1c = uVar2;
      if (codepoint != (int32_t *)0x0) {
        *codepoint = local_1c;
      }
      buffer = buffer + size;
    }
  }
  return buffer;
}

Assistant:

const char *utf8_iterate(const char *buffer, size_t bufsize, int32_t *codepoint)
{
    size_t count;
    int32_t value;

    if(!bufsize)
        return buffer;

    count = utf8_check_first(buffer[0]);
    if(count <= 0)
        return NULL;

    if(count == 1)
        value = (unsigned char)buffer[0];
    else
    {
        if(count > bufsize || !utf8_check_full(buffer, count, &value))
            return NULL;
    }

    if(codepoint)
        *codepoint = value;

    return buffer + count;
}